

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsCheckIfNDefDefine.cxx
# Opt level: O3

bool __thiscall kws::Parser::CheckIfNDefDefine(Parser *this,char *match,bool uppercaseTheDefinition)

{
  char cVar1;
  pointer pcVar2;
  bool bVar3;
  string *psVar4;
  int iVar5;
  long lVar6;
  char *__s;
  ulong uVar7;
  size_t pos;
  size_t sVar8;
  long *plVar9;
  size_t sVar10;
  long *plVar11;
  undefined7 in_register_00000011;
  byte bVar12;
  ulong uVar13;
  char *pcVar14;
  bool bVar15;
  Error error;
  string toMatch;
  string ifndef;
  string l;
  string extension;
  string nameofclass;
  string define;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  undefined1 local_190 [24];
  _Alloc_hider local_178;
  char *local_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  string *local_158;
  undefined4 local_14c;
  char *local_148;
  size_t local_140;
  char local_138 [16];
  size_t local_128;
  undefined1 *local_120;
  size_t local_118;
  undefined1 local_110 [16];
  char *local_100;
  string *local_f8;
  undefined1 *local_f0 [2];
  undefined1 local_e0 [16];
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  undefined1 *local_b0 [2];
  undefined1 local_a0 [16];
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  undefined1 *local_70;
  size_t local_68;
  undefined1 local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  bVar12 = 0;
  lVar6 = std::__cxx11::string::find((char *)&this->m_Filename,0x17626d,0);
  if (lVar6 != -1) goto LAB_0014c529;
  local_14c = (undefined4)CONCAT71(in_register_00000011,uppercaseTheDefinition);
  this->m_TestsDone[0xe] = true;
  local_f8 = &this->m_Filename;
  __s = (char *)operator_new__(0x200);
  builtin_strncpy(__s,"#ifndef/#define should match ",0x1e);
  pcVar14 = (char *)this->m_TestsDescription[0xe]._M_string_length;
  strlen(__s);
  std::__cxx11::string::_M_replace((ulong)(this->m_TestsDescription + 0xe),0,pcVar14,(ulong)__s);
  local_100 = match;
  std::__cxx11::string::string((string *)local_f0,match,(allocator *)local_190);
  uVar7 = std::__cxx11::string::find((char *)local_f0,0x176488,0);
  if (uVar7 != 0xffffffffffffffff) {
    do {
      std::__cxx11::string::replace((ulong)local_f0,uVar7,(char *)0x1,0x175634);
      uVar7 = std::__cxx11::string::find((char *)local_f0,0x176488,0);
    } while (uVar7 != 0xffffffffffffffff);
  }
  uVar7 = std::__cxx11::string::find((char *)local_f0,0x1759b2,0);
  if (uVar7 != 0xffffffffffffffff) {
    do {
      std::__cxx11::string::replace((ulong)local_f0,uVar7,(char *)0x1,0x175639);
      uVar7 = std::__cxx11::string::find((char *)local_f0,0x1759b2,0);
    } while (uVar7 != 0xffffffffffffffff);
  }
  std::__cxx11::string::_M_append((char *)(this->m_TestsDescription + 0xe),(ulong)local_f0[0]);
  operator_delete__(__s);
  psVar4 = &this->m_BufferNoComment;
  pos = std::__cxx11::string::find((char *)psVar4,0x17628e,0);
  if (pos == 0xffffffffffffffff) {
LAB_0014be59:
    local_170 = (char *)0x0;
    local_168._M_local_buf[0] = '\0';
    local_178._M_p = (pointer)&local_168;
    local_190._0_8_ = GetLineNumber(this,0,true);
    local_190._16_8_ = 0xe;
    local_190._8_8_ = local_190._0_8_;
    std::__cxx11::string::_M_replace((ulong)&local_178,0,local_170,0x176296);
    std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
              (&this->m_ErrorList,(value_type *)local_190);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_p != &local_168) {
      operator_delete(local_178._M_p);
    }
    bVar12 = 0;
  }
  else {
    sVar8 = pos;
    if ((long)pos < 1) {
      bVar15 = false;
    }
    else {
      sVar10 = 0;
      bVar15 = false;
      do {
        cVar1 = (psVar4->_M_dataplus)._M_p[sVar10];
        if (((cVar1 != '\r') && (cVar1 != ' ')) && (cVar1 != '\n')) {
          bVar15 = true;
        }
        sVar10 = sVar10 + 1;
      } while (pos != sVar10);
      if (bVar15) goto LAB_0014be59;
    }
    do {
      local_128 = sVar8;
      local_158 = psVar4;
      psVar4 = local_158;
      if (bVar15) {
        local_170 = (char *)0x0;
        local_168._M_local_buf[0] = '\0';
        local_178._M_p = (pointer)&local_168;
        local_190._0_8_ = GetLineNumber(this,local_128,true);
        local_190._16_8_ = 0xe;
        local_190._8_8_ = local_190._0_8_;
        std::__cxx11::string::_M_replace((ulong)&local_178,0,local_170,0x176334);
        std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
                  (&this->m_ErrorList,(value_type *)local_190);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178._M_p != &local_168) {
          operator_delete(local_178._M_p);
        }
        bVar12 = 1;
        break;
      }
      pcVar2 = (local_158->_M_dataplus)._M_p;
      lVar6 = pos + 7;
      uVar7 = pos + 9;
      do {
        uVar13 = uVar7;
        bVar12 = pcVar2[lVar6 + 1];
        lVar6 = lVar6 + 1;
        uVar7 = uVar13 + 1;
      } while (bVar12 == 0x20);
      while ((0x20 < bVar12 || ((0x100002400U >> ((ulong)bVar12 & 0x3f) & 1) == 0))) {
        bVar12 = pcVar2[uVar13];
        uVar13 = uVar13 + 1;
      }
      std::__cxx11::string::substr((ulong)&local_120,(ulong)local_158);
      pos = uVar13 - 1;
      lVar6 = std::__cxx11::string::find((char *)psVar4,0x1762aa,pos);
      if (lVar6 == -1) {
        local_170 = (char *)0x0;
        local_168._M_local_buf[0] = '\0';
        local_178._M_p = (pointer)&local_168;
        local_190._0_8_ = GetLineNumber(this,pos,true);
        local_190._16_8_ = 0xe;
        local_190._8_8_ = local_190._0_8_;
        std::__cxx11::string::_M_replace((ulong)&local_178,0,local_170,0x1762b2);
        std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
                  (&this->m_ErrorList,(value_type *)local_190);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178._M_p != &local_168) {
          operator_delete(local_178._M_p);
        }
        bVar3 = false;
        __s = (char *)0x0;
      }
      else {
        pcVar2 = (psVar4->_M_dataplus)._M_p;
        sVar8 = lVar6 + 6;
        do {
          bVar12 = pcVar2[sVar8 + 1];
          sVar8 = sVar8 + 1;
        } while (bVar12 == 0x20);
        while ((0x20 < bVar12 || ((0x100002400U >> ((ulong)bVar12 & 0x3f) & 1) == 0))) {
          bVar12 = pcVar2[sVar8 + 1];
          sVar8 = sVar8 + 1;
        }
        std::__cxx11::string::substr((ulong)&local_70,(ulong)local_158);
        if ((local_118 == local_68) &&
           ((local_118 == 0 || (iVar5 = bcmp(local_120,local_70,local_118), iVar5 == 0)))) {
          psVar4 = local_f8;
          if ((this->m_Filename)._M_string_length == 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"CheckIfNDefDefine() : m_Filename should be set",0x2e);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
            std::ostream::put('h');
            std::ostream::flush();
            bVar3 = false;
            __s = (char *)0x0;
          }
          else {
            std::__cxx11::string::find_last_of((char *)local_f8,0x177441,0xffffffffffffffff);
            std::__cxx11::string::find_last_of((char *)psVar4,0x169531,0xffffffffffffffff);
            std::__cxx11::string::substr((ulong)local_90,(ulong)psVar4);
            std::__cxx11::string::substr((ulong)local_b0,(ulong)psVar4);
            std::__cxx11::string::string((string *)&local_148,local_100,(allocator *)local_190);
            uVar7 = std::__cxx11::string::find((char *)&local_148,0x1762f5,0);
            if (uVar7 != 0xffffffffffffffff) {
              std::__cxx11::string::replace((ulong)&local_148,uVar7,(char *)0xd,(ulong)local_90[0]);
            }
            uVar7 = std::__cxx11::string::find((char *)&local_148,0x16849e,0);
            if (uVar7 != 0xffffffffffffffff) {
              std::__cxx11::string::replace((ulong)&local_148,uVar7,(char *)0xb,(ulong)local_b0[0]);
            }
            if ((char)local_14c == '\0') {
LAB_0014c1f9:
              pcVar14 = local_148;
              if ((local_118 != local_140) ||
                 ((__s = (char *)0x1, local_140 != 0 &&
                  (iVar5 = bcmp(local_120,local_148,local_140), iVar5 != 0)))) {
LAB_0014c28a:
                local_178._M_p = (pointer)&local_168;
                local_170 = (char *)0x0;
                local_168._M_local_buf[0] = '\0';
                local_190._0_8_ = GetLineNumber(this,local_128,true);
                local_190._8_8_ = GetLineNumber(this,sVar8,true);
                local_190._16_8_ = 0xe;
                std::__cxx11::string::_M_replace((ulong)&local_178,0,local_170,0x176303);
                local_50[0] = local_40;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_50,local_120,local_120 + local_118);
                std::__cxx11::string::append((char *)local_50);
                plVar9 = (long *)std::__cxx11::string::_M_append((char *)local_50,(ulong)local_148);
                plVar11 = plVar9 + 2;
                if ((long *)*plVar9 == plVar11) {
                  local_c0 = *plVar11;
                  lStack_b8 = plVar9[3];
                  local_d0 = &local_c0;
                }
                else {
                  local_c0 = *plVar11;
                  local_d0 = (long *)*plVar9;
                }
                local_c8 = plVar9[1];
                *plVar9 = (long)plVar11;
                plVar9[1] = 0;
                *(undefined1 *)(plVar9 + 2) = 0;
                std::__cxx11::string::operator=((string *)&local_178,(string *)&local_d0);
                if (local_d0 != &local_c0) {
                  operator_delete(local_d0);
                }
                if (local_50[0] != local_40) {
                  operator_delete(local_50[0]);
                }
                std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
                          (&this->m_ErrorList,(value_type *)local_190);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_178._M_p != &local_168) {
                  operator_delete(local_178._M_p);
                }
                __s = (char *)0x0;
                pcVar14 = local_148;
              }
            }
            else {
              pcVar14 = local_148;
              if (local_140 != 0) {
                do {
                  iVar5 = toupper((int)*pcVar14);
                  *pcVar14 = (char)iVar5;
                  pcVar14 = pcVar14 + 1;
                } while (pcVar14 != local_148 + local_140);
                goto LAB_0014c1f9;
              }
              if (local_118 != 0) goto LAB_0014c28a;
              __s = (char *)0x1;
            }
            if (pcVar14 != local_138) {
              operator_delete(pcVar14);
            }
            if (local_b0[0] != local_a0) {
              operator_delete(local_b0[0]);
            }
            if (local_90[0] != local_80) {
              operator_delete(local_90[0]);
            }
            bVar3 = false;
          }
        }
        else {
          pos = std::__cxx11::string::find((char *)local_158,0x17628e,uVar13);
          bVar15 = pos == 0xffffffffffffffff;
          bVar3 = true;
        }
        if (local_70 != local_60) {
          operator_delete(local_70);
        }
      }
      bVar12 = (byte)__s;
      if (local_120 != local_110) {
        operator_delete(local_120);
      }
      psVar4 = local_158;
      sVar8 = local_128;
    } while (bVar3);
  }
  if (local_f0[0] != local_e0) {
    operator_delete(local_f0[0]);
  }
LAB_0014c529:
  return (bool)(bVar12 & 1);
}

Assistant:

bool Parser::CheckIfNDefDefine(const char* match, bool uppercaseTheDefinition)
{
  // Check only if we are not a .cxx or .cc or .c file
  if(m_Filename.find(".c") != std::string::npos)
    {
    return false;
    }

  m_TestsDone[NDEFINE] = true;
  constexpr size_t length = 512;
  char* val = new char[length];
  snprintf(val,length,"#ifndef/#define should match ");
  m_TestsDescription[NDEFINE] = val;
  // Replace < and >
  std::string l = match;
  auto inf = static_cast<long int>(l.find("<", 0));
  while(inf != -1)
    {
    l.replace(inf,1,"&lt;");
    inf = static_cast<long int>(l.find("<",0));
    }

    auto sup = static_cast<long int>(l.find(">", 0));
    while (sup != -1) {
      l.replace(sup, 1, "&gt;");
      sup = static_cast<long int>(l.find(">", 0));
    }
  m_TestsDescription[NDEFINE] += l;
  delete [] val;

  bool hasError = false;
  bool notDefined = false;


  // We should have a #ifndef/#define on the same line and we go
  // through the file until we find a correct match.
  bool doesMatch = true;

  // Find the #ifndef word in the file
  auto pos = static_cast<long int>(m_BufferNoComment.find("#ifndef", 0));
  if(pos == -1)
    {
    notDefined = true;
    }
  else
    {
    for(long int i=0;i<pos;i++)
      {
      if((m_BufferNoComment[i] != ' ')
        && (m_BufferNoComment[i] != '\r')
        && (m_BufferNoComment[i] != '\n')
        )
        {
        notDefined = true;
        }
      }
    }

  long int definepos = pos;

  if(notDefined)
    {
    Error error;
    error.line = this->GetLineNumber(0,true);
    error.line2 = error.line;
    error.number = NDEFINE;
    error.description = "#ifndef not defined";
    m_ErrorList.push_back(error);
    return false;
    }

  while(!notDefined)
    {
    doesMatch = true;

    // Find the word after #ifndef
    pos += 8;
   
    while(m_BufferNoComment[pos] == ' ')
      {
      pos++;
      }
    long int begin = pos;
    while((m_BufferNoComment[pos] != ' ') 
      &&(m_BufferNoComment[pos] != '\r')
      &&(m_BufferNoComment[pos] != '\n')
      )
      {
      pos++;
      }
    long int end = pos;
    std::string ifndef = m_BufferNoComment.substr(begin,end-begin);

    // Find the word after #define
    auto posDef = static_cast<long int>(m_BufferNoComment.find("#define", end));

    if(posDef == -1)
      {
      Error error;
      error.line = this->GetLineNumber(end,true);
      error.line2 = error.line;
      error.number = NDEFINE;
      error.description = "#define not defined";
      m_ErrorList.push_back(error);
      return false;
      }
    
    posDef += 7; 
    while(m_BufferNoComment[posDef] == ' ')
      {
      posDef++;
      }
    begin = posDef;
    while((m_BufferNoComment[posDef] != ' ') 
      &&(m_BufferNoComment[posDef] != '\r')
      &&(m_BufferNoComment[posDef] != '\n')
      )
      {
      posDef++;
      }
    end = posDef;
    std::string define = m_BufferNoComment.substr(begin,end-begin);

    if(ifndef != define)
      {
      doesMatch = false;
      }

    if(doesMatch)
      {
      if (m_Filename.empty()) {
        std::cout << "CheckIfNDefDefine() : m_Filename should be set" << std::endl;
        return false;
      }

      auto point = static_cast<long int>(m_Filename.find_last_of("."));
      auto slash = static_cast<long int>(m_Filename.find_last_of("/"));

      std::string nameofclass = m_Filename.substr(slash+1,point-slash-1);
      std::string extension = m_Filename.substr(point+1,m_Filename.size()-point-1);

      // construct the string
      std::string toMatch = match;
      auto posnofc = static_cast<long int>(toMatch.find("[NameOfClass]"));
      if(posnofc != -1)
        {
        toMatch.replace(posnofc,13,nameofclass);
        }
      posnofc = static_cast<long int>(toMatch.find("[Extension]"));
      if(posnofc != -1)
        {
        toMatch.replace(posnofc,11,extension);
        }

      if(uppercaseTheDefinition)
        {
        for(std::string::iterator it = toMatch.begin(); it != toMatch.end(); it++)
          *it = static_cast<char>(std::toupper(*it));
        }

      if(ifndef != toMatch)
        {   
        Error error;
        error.line = this->GetLineNumber(definepos,true);
        error.line2 = this->GetLineNumber(end,true);
        error.number = NDEFINE;
        error.description = "#ifndef/#define does not match expression";
        error.description = ifndef+" v.s. "+toMatch;
        m_ErrorList.push_back(error);
        return false;
        }
      else
        {
        return true;
        }
      }

    pos = static_cast<long int>(m_BufferNoComment.find("#ifndef",pos+1));

    if(pos == -1)
      {
      notDefined = true;
      }
    /*else
      {
      for(int i=0;i<pos;i++)
        {
        if((m_BufferNoComment[i] != ' ')
          && (m_BufferNoComment[i] != '\r')
          && (m_BufferNoComment[i] != '\n')
          )
          {
          std::cout << "Not defined!" << std::endl;
          notDefined = true;
          }
        }
      }*/

    } // end looking for entire file


    Error error;
    error.line = this->GetLineNumber(definepos,true);
    error.line2 = error.line;
    error.number = NDEFINE;
    error.description = "#ifndef/#define does not match";
    m_ErrorList.push_back(error);

  return !hasError;
}